

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_by_2_internal.c
# Opt level: O3

void WebRtcSpl_UpBy2IntToShort(int32_t *in,int32_t len,int16_t *out,int32_t *state)

{
  int iVar1;
  int32_t iVar2;
  int iVar3;
  int32_t iVar4;
  int iVar5;
  int32_t iVar6;
  long lVar7;
  int32_t iVar8;
  int iVar9;
  
  if (0 < len) {
    iVar8 = state[7];
    lVar7 = 0;
    iVar6 = state[4];
    iVar2 = state[5];
    iVar4 = state[6];
    do {
      iVar1 = *(int *)((long)in + lVar7 * 2);
      iVar3 = ((iVar1 - iVar2) + 0x2000 >> 0xe) * 0x335 + iVar6;
      state[4] = iVar1;
      iVar5 = ((iVar3 - iVar4 >> 0xe) - (iVar3 - iVar4 >> 0x1f)) * 0x17de + iVar2;
      state[5] = iVar3;
      iVar8 = ((iVar5 - iVar8 >> 0xe) - (iVar5 - iVar8 >> 0x1f)) * 0x305e + iVar4;
      state[7] = iVar8;
      state[6] = iVar5;
      iVar9 = iVar8 >> 0xf;
      if (0x7ffe < iVar9) {
        iVar9 = 0x7fff;
      }
      if (iVar9 < -0x7fff) {
        iVar9 = -0x8000;
      }
      out[(int)lVar7] = (int16_t)iVar9;
      lVar7 = lVar7 + 2;
      iVar6 = iVar1;
      iVar2 = iVar3;
      iVar4 = iVar5;
    } while ((ulong)(uint)len * 2 != lVar7);
    if (0 < len) {
      iVar8 = state[3];
      lVar7 = 0;
      iVar6 = *state;
      iVar2 = state[1];
      iVar4 = state[2];
      do {
        iVar1 = *(int *)((long)in + lVar7 * 2);
        iVar5 = ((iVar1 - iVar2) + 0x2000 >> 0xe) * 0xbea + iVar6;
        *state = iVar1;
        iVar9 = ((iVar5 - iVar4 >> 0xe) - (iVar5 - iVar4 >> 0x1f)) * 0x2498 + iVar2;
        state[1] = iVar5;
        iVar8 = ((iVar9 - iVar8 >> 0xe) - (iVar9 - iVar8 >> 0x1f)) * 0x3ad7 + iVar4;
        state[3] = iVar8;
        state[2] = iVar9;
        iVar3 = iVar8 >> 0xf;
        if (0x7ffe < iVar3) {
          iVar3 = 0x7fff;
        }
        if (iVar3 < -0x7fff) {
          iVar3 = -0x8000;
        }
        out[(long)(int)lVar7 + 1] = (int16_t)iVar3;
        lVar7 = lVar7 + 2;
        iVar6 = iVar1;
        iVar2 = iVar5;
        iVar4 = iVar9;
      } while ((ulong)(uint)len * 2 != lVar7);
    }
  }
  return;
}

Assistant:

void WebRtcSpl_UpBy2IntToShort(const int32_t *in, int32_t len, int16_t *out,
                               int32_t *state)
{
    int32_t tmp0, tmp1, diff;
    int32_t i;

    // upper allpass filter (generates odd output samples)
    for (i = 0; i < len; i++)
    {
        tmp0 = in[i];
        diff = tmp0 - state[5];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[4] + diff * kResampleAllpass[0][0];
        state[4] = tmp0;
        diff = tmp1 - state[6];
        // scale down and round
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[5] + diff * kResampleAllpass[0][1];
        state[5] = tmp1;
        diff = tmp0 - state[7];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[7] = state[6] + diff * kResampleAllpass[0][2];
        state[6] = tmp0;

        // scale down, saturate and store
        tmp1 = state[7] >> 15;
        if (tmp1 > (int32_t)0x00007FFF)
            tmp1 = 0x00007FFF;
        if (tmp1 < (int32_t)0xFFFF8000)
            tmp1 = 0xFFFF8000;
        out[i << 1] = (int16_t)tmp1;
    }

    out++;

    // lower allpass filter (generates even output samples)
    for (i = 0; i < len; i++)
    {
        tmp0 = in[i];
        diff = tmp0 - state[1];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[0] + diff * kResampleAllpass[1][0];
        state[0] = tmp0;
        diff = tmp1 - state[2];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[1] + diff * kResampleAllpass[1][1];
        state[1] = tmp1;
        diff = tmp0 - state[3];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[3] = state[2] + diff * kResampleAllpass[1][2];
        state[2] = tmp0;

        // scale down, saturate and store
        tmp1 = state[3] >> 15;
        if (tmp1 > (int32_t)0x00007FFF)
            tmp1 = 0x00007FFF;
        if (tmp1 < (int32_t)0xFFFF8000)
            tmp1 = 0xFFFF8000;
        out[i << 1] = (int16_t)tmp1;
    }
}